

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O0

_Bool trans_csrrw(DisasContext_conflict12 *ctx,arg_csrrw *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 ret;
  TCGv_i64 retval;
  TCGv_i64 ret_00;
  TCGv_i64 rs1_pass;
  TCGv_i64 dest;
  TCGv_i64 csr_store;
  TCGv_i64 source1;
  TCGContext_conflict11 *tcg_ctx;
  arg_csrrw *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  retval = tcg_temp_new_i64(tcg_ctx_00);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_get_gpr(tcg_ctx_00,t,a->rs1);
  tcg_gen_movi_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_pc,(ctx->base).pc_next);
  tcg_gen_movi_i64_riscv64(tcg_ctx_00,ret_00,(long)a->rs1);
  tcg_gen_movi_i64_riscv64(tcg_ctx_00,ret,(long)a->csr);
  gen_io_start(tcg_ctx_00);
  gen_helper_csrrw(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,t,ret);
  gen_set_gpr(tcg_ctx_00,a->rd,retval);
  tcg_gen_movi_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_pc,ctx->pc_succ_insn);
  exit_tb(ctx);
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  tcg_temp_free_i64(tcg_ctx_00,retval);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  return true;
}

Assistant:

static bool trans_csrrw(DisasContext *ctx, arg_csrrw *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv source1, csr_store, dest, rs1_pass;
    RISCV_OP_CSR_PRE;
    gen_helper_csrrw(tcg_ctx, dest, tcg_ctx->cpu_env, source1, csr_store);
    RISCV_OP_CSR_POST;
    return true;
}